

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* readlines(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,string *filename)

{
  char cVar1;
  string line;
  fstream in;
  undefined1 auStack_258 [8];
  value_type local_250;
  long local_230 [4];
  int aiStack_210 [124];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(local_230);
  std::fstream::open((string *)local_230,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0) {
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    cVar1 = std::ios::widen((char)auStack_258 + (char)*(long *)(local_230[0] + -0x18) + '(');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_230,(string *)&local_250,cVar1);
    while (*(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_250);
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) +
                              (char)(istream *)local_230);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_230,(string *)&local_250,cVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                               local_250.field_2._M_local_buf[0]) + 1);
    }
    std::fstream::~fstream(local_230);
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"File could not be opened.",0x19);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(1);
}

Assistant:

std::vector<std::string> readlines(const std::string filename)
{
    std::vector<std::string> lines;
    std::fstream in;
    in.open(filename);
    if (in.rdstate() != std::ios_base::goodbit) {
        std::cout << "File could not be opened." << std::endl;
        exit(1);
    }
    std::string line;
    std::getline(in, line);
    while (in.rdstate() == std::ios_base::goodbit) {
        lines.push_back(line);
        std::getline(in, line);
    }
    return lines;
}